

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.c
# Opt level: O0

void octaveInitBeta(OctaveNoise *noise,uint64_t *seed,PerlinNoise *octaves,int octcnt,double lac,
                   double lacMul,double persist,double persistMul)

{
  int in_ECX;
  long in_RDX;
  int *in_RDI;
  uint64_t *in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  int i;
  int local_44;
  double local_38;
  undefined4 in_stack_ffffffffffffffe0;
  
  local_38 = in_XMM2_Qa;
  for (local_44 = 0; local_44 < in_ECX; local_44 = local_44 + 1) {
    perlinInit((PerlinNoise *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_XMM0_Qa);
    *(double *)(in_RDX + (long)local_44 * 0x140 + 0x120) = local_38;
    *(uint64_t **)(in_RDX + (long)local_44 * 0x140 + 0x128) = in_XMM0_Qa;
    local_38 = in_XMM3_Qa * local_38;
    in_XMM0_Qa = (uint64_t *)(in_XMM1_Qa * (double)in_XMM0_Qa);
  }
  *(long *)(in_RDI + 2) = in_RDX;
  *in_RDI = in_ECX;
  return;
}

Assistant:

void octaveInitBeta(OctaveNoise *noise, uint64_t *seed, PerlinNoise *octaves,
    int octcnt, double lac, double lacMul, double persist, double persistMul)
{
    int i;
    for (i = 0; i < octcnt; i++)
    {
        perlinInit(&octaves[i], seed);
        octaves[i].amplitude = persist;
        octaves[i].lacunarity = lac;
        persist *= persistMul;
        lac *= lacMul;
    }
    noise->octaves = octaves;
    noise->octcnt = octcnt;
}